

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::FboCases::IntersectingQuadsTest::IntersectingQuadsTest
          (IntersectingQuadsTest *this,Context *context,FboConfig *config,bool npot)

{
  long *plVar1;
  GLenum GVar2;
  GLenum GVar3;
  GLenum GVar4;
  int iVar5;
  undefined8 *puVar6;
  undefined7 in_register_00000009;
  char *pcVar7;
  ulong uVar8;
  undefined8 uVar9;
  long *local_88;
  long local_78;
  undefined8 uStack_70;
  string local_68;
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  pcVar7 = "";
  if ((int)CONCAT71(in_register_00000009,npot) != 0) {
    pcVar7 = "npot_";
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,pcVar7,
             pcVar7 + (CONCAT71(in_register_00000009,npot) & 0xffffffff) * 5);
  FboConfig::getName_abi_cxx11_(&local_68,config);
  uVar8 = 0xf;
  if (local_48 != local_38) {
    uVar8 = local_38[0];
  }
  if (uVar8 < local_68._M_string_length + local_40) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar9 = local_68.field_2._M_allocated_capacity;
    }
    if (local_68._M_string_length + local_40 <= (ulong)uVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_48);
      goto LAB_00ff5167;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68._M_dataplus._M_p);
LAB_00ff5167:
  local_88 = &local_78;
  plVar1 = puVar6 + 2;
  if ((long *)*puVar6 == plVar1) {
    local_78 = *plVar1;
    uStack_70 = puVar6[3];
  }
  else {
    local_78 = *plVar1;
    local_88 = (long *)*puVar6;
  }
  *puVar6 = plVar1;
  puVar6[1] = 0;
  *(undefined1 *)plVar1 = 0;
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,(char *)local_88,"Intersecting textured quads");
  (this->super_FboRenderCase).super_TestCase.m_context = context;
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_0216ef38;
  GVar2 = config->stencilbufferFormat;
  (this->super_FboRenderCase).m_config.stencilbufferType = config->stencilbufferType;
  (this->super_FboRenderCase).m_config.stencilbufferFormat = GVar2;
  GVar2 = config->colorbufferFormat;
  GVar3 = config->depthbufferType;
  GVar4 = config->depthbufferFormat;
  (this->super_FboRenderCase).m_config.colorbufferType = config->colorbufferType;
  (this->super_FboRenderCase).m_config.colorbufferFormat = GVar2;
  (this->super_FboRenderCase).m_config.depthbufferType = GVar3;
  (this->super_FboRenderCase).m_config.depthbufferFormat = GVar4;
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_0216efb8;
  this->m_fboWidth = 0x80 - (uint)npot;
  iVar5 = 0x5f;
  if (!npot) {
    iVar5 = 0x80;
  }
  this->m_fboHeight = iVar5;
  return;
}

Assistant:

IntersectingQuadsTest::IntersectingQuadsTest (Context& context, const FboConfig& config, bool npot)
	: FboRenderCase	(context, (string(npot ? "npot_" : "") + config.getName()).c_str(), "Intersecting textured quads", config)
	, m_fboWidth	(npot ? 127 : 128)
	, m_fboHeight	(npot ?  95 : 128)
{
}